

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O1

void __thiscall protozero::pbf_reader::skip(pbf_reader *this)

{
  char *pcVar1;
  char *pcVar2;
  uint len;
  assert_error *this_00;
  undefined8 *puVar3;
  char *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  char *pcVar6;
  bool bVar7;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before calling skip()\"");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  switch(this->m_wire_type) {
  case varint:
    pcVar1 = this->m_data;
    pcVar2 = this->m_end;
    bVar7 = pcVar1 == pcVar2;
    pcVar4 = pcVar1;
    if (!bVar7) {
      pcVar6 = pcVar1;
      if (*pcVar1 < '\0') {
        do {
          pcVar6 = pcVar6 + 1;
          bVar7 = pcVar6 == pcVar2;
          pcVar4 = pcVar2;
          if (bVar7) break;
          pcVar4 = pcVar6;
        } while (*pcVar6 < '\0');
      }
      else {
        bVar7 = false;
      }
    }
    if ((long)pcVar4 - (long)pcVar1 < 10) {
      if (!bVar7) {
        this->m_data = pcVar4 + 1;
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_002581d0;
      ppuVar5 = &end_of_buffer_exception::typeinfo;
    }
    else {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_002581a8;
      ppuVar5 = &varint_too_long_exception::typeinfo;
    }
    __cxa_throw(puVar3,ppuVar5,std::exception::~exception);
  case fixed64:
    len = 8;
    break;
  case length_delimited:
    len = get_varint<unsigned_int>(this);
    break;
  default:
    return;
  case fixed32:
    len = 4;
  }
  skip_bytes(this,len);
  return;
}

Assistant:

void skip() {
        protozero_assert(tag() != 0 && "call next() before calling skip()");
        switch (wire_type()) {
            case pbf_wire_type::varint:
                skip_varint(&m_data, m_end);
                break;
            case pbf_wire_type::fixed64:
                skip_bytes(8);
                break;
            case pbf_wire_type::length_delimited:
                skip_bytes(get_length());
                break;
            case pbf_wire_type::fixed32:
                skip_bytes(4);
                break;
            default:
                break;
        }
    }